

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O2

void __thiscall KalmanFilter::UpdateOps(KalmanFilter *this,VectorXd *y)

{
  MatrixXd *a_lhs;
  MatrixXd *this_00;
  Index nbRows;
  PlainObject *pPVar1;
  MatrixXd Si;
  MatrixXd K;
  MatrixXd Ht;
  MatrixXd I;
  MatrixXd PHt;
  MatrixXd S;
  undefined1 local_130 [32];
  double *local_110;
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_d0;
  Matrix<double,__1,__1,_0,__1,__1> local_b8;
  Matrix<double,__1,__1,_0,__1,__1> local_a0;
  void *local_88 [3];
  Matrix<double,__1,__1,_0,__1,__1> local_70;
  void *local_58 [3];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>
  local_40;
  
  a_lhs = &this->H_;
  local_130._0_8_ = a_lhs;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_a0,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_130);
  this_00 = &this->P_;
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase(&local_f8,a_lhs,this_00);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 *)local_130,
                (GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
                 *)&local_f8,&local_a0);
  Eigen::
  MatrixBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,5>,Eigen::Matrix<double,-1,-1,0,-1,-1>,5>>
  ::operator+(&local_d0,
              (MatrixBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>>
               *)local_130,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_58,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_d0);
  free((void *)local_130._16_8_);
  free(local_f8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  local_130._0_8_ =
       Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                 ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_58);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::internal::inverse_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_d0,
             (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_130);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 *)local_130,this_00,&local_a0);
  pPVar1 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_130);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_70,pPVar1);
  free((void *)local_130._16_8_);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 *)local_130,&local_70,(Matrix<double,__1,__1,_0,__1,__1> *)&local_d0);
  pPVar1 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)local_130);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&local_b8,pPVar1);
  free((void *)local_130._16_8_);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *)local_130,&local_b8,y);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
              *)&local_f8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->x_,
             (MatrixBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
              *)local_130);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&this->x_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>_>
              *)&local_f8);
  free((void *)local_130._16_8_);
  nbRows = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)local_130,nbRows,nbRows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_88,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_130);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase(&local_f8,&local_b8,a_lhs);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
            (&local_40,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_88,
             (MatrixBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>
              *)&local_f8);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 *)local_130,&local_40,this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  _set<Eigen::GeneralProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
             (DenseBase<Eigen::GeneralProduct<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>
              *)local_130);
  free(local_110);
  free(local_f8.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_88[0]);
  free(local_b8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_d0.m_lhs);
  free(local_58[0]);
  free(local_a0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void KalmanFilter::UpdateOps(const VectorXd &y) {
  /*
  perform rest of kalman filter update
  */

  MatrixXd Ht = H_.transpose();
  MatrixXd S = H_ * P_ * Ht + R_;
  MatrixXd Si = S.inverse();
  MatrixXd PHt = P_ * Ht;
  MatrixXd K = PHt * Si; // kalman gain

  // new estimate
  x_ = x_ + (K * y);
  long x_size = x_.size();
  MatrixXd I = MatrixXd::Identity(x_size, x_size);
  P_ = (I - K * H_) * P_;
}